

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

bool __thiscall
r_exec::CTPX::build_mdl
          (CTPX *this,_Fact *f_icst,_Fact *cause_pattern,_Fact *consequent,
          GuardBuilder *guard_builder,uint64_t period)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  bool bVar3;
  int iVar4;
  BindingMap *this_00;
  undefined4 extraout_var;
  Code *mdl;
  P<r_exec::BindingMap> this_01;
  uint16_t write_index;
  P<r_exec::BindingMap> bm;
  
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  p_Var2 = (this->super__TPX).super_TPX.target.object;
  bm.object = (_Object *)this_00;
  iVar4 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
  BindingMap::init(this_00,(EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar4));
  BindingMap::init((BindingMap *)bm.object,
                   (EVP_PKEY_CTX *)(this->super__TPX).super_TPX.target.object);
  this_01 = bm;
  BindingMap::init((BindingMap *)bm.object,
                   (EVP_PKEY_CTX *)(this->super__TPX).super_TPX.target.object);
  mdl = _TPX::build_mdl_head
                  ((_TPX *)this_01.object,(HLPBindingMap *)bm.object,3,f_icst,consequent,
                   &write_index);
  (*(guard_builder->super__Object)._vptr__Object[2])(guard_builder,mdl,0,cause_pattern,&write_index)
  ;
  _TPX::build_mdl_tail(&this->super__TPX,mdl,write_index);
  bVar3 = build_requirement(this,(HLPBindingMap *)bm.object,mdl,(uint64_t)cause_pattern);
  core::P<r_exec::BindingMap>::~P(&bm);
  return bVar3;
}

Assistant:

bool CTPX::build_mdl(_Fact *f_icst, _Fact *cause_pattern, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<BindingMap> bm = new BindingMap();
    bm->init(target->get_reference(0), MK_VAL_VALUE);
    bm->init(target, FACT_AFTER);
    bm->init(target, FACT_BEFORE);
    uint16_t write_index;
    Code *m0 = build_mdl_head(bm, 3, f_icst, consequent, write_index);
    guard_builder->build(m0, nullptr, cause_pattern, write_index);
    build_mdl_tail(m0, write_index);
    return build_requirement(bm, m0, period); // existence checks performed there.
}